

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_fix.cpp
# Opt level: O1

void Omega_h::compute_ill_metric_dim<1>(Mesh *mesh,AdaptOpts *opts,Omega_h_Isotropy isotropy)

{
  int *piVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  Alloc *pAVar3;
  uint uVar4;
  undefined8 uVar5;
  Alloc *pAVar6;
  LO LVar7;
  int iVar8;
  ostream *poVar9;
  ulong uVar10;
  Int i;
  Reals metrics;
  Reals elem_metrics;
  type f;
  Write<double> elem_metrics_w;
  Read<double> prelim_quals;
  undefined1 local_1d8 [40];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b0;
  Alloc *local_1a0;
  pointer local_198;
  Int local_18c;
  undefined1 local_188 [16];
  undefined1 local_178 [48];
  Alloc *local_148;
  Alloc *local_140;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_138;
  Read<signed_char> local_130;
  Reals local_120;
  Read<double> local_110;
  Reals local_100;
  Read<double> local_f0;
  Read<double> local_e0;
  Reals local_d0;
  Read<double> local_c0;
  Write<double> local_b0;
  Alloc *local_a0;
  element_type *local_98;
  Read<double> local_90;
  Read<double> local_80;
  Reals local_70;
  Reals local_60;
  Alloc *local_50 [2];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  
  local_188._0_8_ = local_178;
  local_178._40_8_ = opts;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_188,"metric","");
  Mesh::remove_tag(mesh,0,(string *)local_188);
  if ((Alloc *)local_188._0_8_ != (Alloc *)local_178) {
    operator_delete((void *)local_188._0_8_,local_178._0_8_ + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"getting element implied metrics\n",0x20);
  get_element_implied_length_metrics((Omega_h *)&local_1a0,mesh);
  LVar7 = Mesh::nelems(mesh);
  local_70.write_.shared_alloc_.alloc = local_1a0;
  if (((ulong)local_1a0 & 7) == 0 && local_1a0 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_70.write_.shared_alloc_.alloc = (Alloc *)(local_1a0->size * 8 + 1);
    }
    else {
      local_1a0->use_count = local_1a0->use_count + 1;
    }
  }
  local_70.write_.shared_alloc_.direct_ptr = local_198;
  apply_isotropy((Omega_h *)local_188,LVar7,&local_70,isotropy);
  if (((ulong)local_1a0 & 7) == 0 && local_1a0 != (Alloc *)0x0) {
    piVar1 = &local_1a0->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_1a0);
      operator_delete(local_1a0,0x48);
    }
  }
  local_1a0 = (Alloc *)local_188._0_8_;
  local_198 = (pointer)local_188._8_8_;
  if (((local_188._0_8_ & 7) == 0 && (Alloc *)local_188._0_8_ != (Alloc *)0x0) &&
     (entering_parallel == '\x01')) {
    *(int *)(local_188._0_8_ + 0x30) = *(int *)(local_188._0_8_ + 0x30) + -1;
    local_1a0 = (Alloc *)(*(long *)local_188._0_8_ * 8 + 1);
  }
  pAVar3 = local_70.write_.shared_alloc_.alloc;
  local_188._0_8_ = (pointer)0x0;
  local_188._8_8_ = (void *)0x0;
  if (((ulong)local_70.write_.shared_alloc_.alloc & 7) == 0 &&
      local_70.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_70.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_70.write_.shared_alloc_.alloc);
      operator_delete(pAVar3,0x48);
    }
  }
  if (((ulong)local_1a0 & 1) == 0) {
    uVar10 = local_1a0->size;
  }
  else {
    uVar10 = (ulong)local_1a0 >> 3;
  }
  LVar7 = Mesh::nelems(mesh);
  local_18c = divide_no_remainder<int>((int)(uVar10 >> 3),LVar7);
  local_188._0_8_ = local_178;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_188,"metric","");
  local_80.write_.shared_alloc_.alloc = local_1a0;
  if (((ulong)local_1a0 & 7) == 0 && local_1a0 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_80.write_.shared_alloc_.alloc = (Alloc *)(local_1a0->size * 8 + 1);
    }
    else {
      local_1a0->use_count = local_1a0->use_count + 1;
    }
  }
  local_80.write_.shared_alloc_.direct_ptr = local_198;
  Mesh::add_tag<double>(mesh,1,(string *)local_188,local_18c,&local_80,false);
  pAVar3 = local_80.write_.shared_alloc_.alloc;
  if (((ulong)local_80.write_.shared_alloc_.alloc & 7) == 0 &&
      local_80.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_80.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(pAVar3);
      operator_delete(pAVar3,0x48);
    }
  }
  if ((undefined1 *)local_188._0_8_ != local_178) {
    operator_delete((void *)local_188._0_8_,local_178._0_8_ + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"projecting them\n",0x10)
  ;
  local_60.write_.shared_alloc_.alloc = local_1a0;
  if (((ulong)local_1a0 & 7) == 0 && local_1a0 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_60.write_.shared_alloc_.alloc = (Alloc *)(local_1a0->size * 8 + 1);
    }
    else {
      local_1a0->use_count = local_1a0->use_count + 1;
    }
  }
  local_60.write_.shared_alloc_.direct_ptr = local_198;
  local_138 = &local_1b0;
  project_metrics((Omega_h *)local_138->_M_local_buf,mesh,&local_60);
  pAVar3 = local_60.write_.shared_alloc_.alloc;
  if (((ulong)local_60.write_.shared_alloc_.alloc & 7) == 0 &&
      local_60.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_60.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(pAVar3);
      operator_delete(pAVar3,0x48);
    }
  }
  if ((local_1b0._M_allocated_capacity & 1) == 0) {
    uVar10 = *(ulong *)local_1b0._M_allocated_capacity;
  }
  else {
    uVar10 = local_1b0._M_allocated_capacity >> 3;
  }
  LVar7 = Mesh::nverts(mesh);
  iVar8 = divide_no_remainder<int>((int)(uVar10 >> 3),LVar7);
  if (local_18c != iVar8) {
    fail("assertion %s failed at %s +%d\n",
         "ncomps == divide_no_remainder(metrics.size(), mesh->nverts())",
         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_fix.cpp"
         ,0x1b);
  }
  if (isotropy == OMEGA_H_ANISOTROPIC) {
    iVar8 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"metric smoothing iteration ",0x1b);
      poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar8);
      local_188[0] = 10;
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,(char *)local_188,1);
      local_120.write_.shared_alloc_.alloc = (Alloc *)local_1b0._M_allocated_capacity;
      if ((local_1b0._M_allocated_capacity & 7) == 0 &&
          (Alloc *)local_1b0._M_allocated_capacity != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_120.write_.shared_alloc_.alloc =
               (Alloc *)(*(ulong *)local_1b0._M_allocated_capacity * 8 + 1);
        }
        else {
          *(int *)(local_1b0._M_allocated_capacity + 0x30) =
               *(int *)(local_1b0._M_allocated_capacity + 0x30) + 1;
        }
      }
      local_120.write_.shared_alloc_.direct_ptr = (void *)local_1b0._8_8_;
      smooth_metric_once((Omega_h *)local_188,mesh,&local_120,true);
      uVar5 = local_1b0._M_allocated_capacity;
      if ((local_1b0._M_allocated_capacity & 7) == 0 &&
          (Alloc *)local_1b0._M_allocated_capacity != (Alloc *)0x0) {
        piVar1 = (int *)(local_1b0._M_allocated_capacity + 0x30);
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc((Alloc *)local_1b0._M_allocated_capacity);
          operator_delete((void *)uVar5,0x48);
        }
      }
      pAVar3 = local_120.write_.shared_alloc_.alloc;
      local_1b0._M_allocated_capacity = local_188._0_8_;
      local_1b0._8_8_ = local_188._8_8_;
      if (((local_188._0_8_ & 7) == 0 && (Alloc *)local_188._0_8_ != (Alloc *)0x0) &&
         (entering_parallel == '\x01')) {
        *(int *)(local_188._0_8_ + 0x30) = *(int *)(local_188._0_8_ + 0x30) + -1;
        local_1b0._M_allocated_capacity = *(ulong *)local_188._0_8_ * 8 + 1;
      }
      local_188._0_8_ = (pointer)0x0;
      local_188._8_8_ = (void *)0x0;
      if (((ulong)local_120.write_.shared_alloc_.alloc & 7) == 0 &&
          local_120.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        piVar1 = &(local_120.write_.shared_alloc_.alloc)->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(local_120.write_.shared_alloc_.alloc);
          operator_delete(pAVar3,0x48);
        }
      }
      iVar8 = iVar8 + 1;
    } while (iVar8 != 5);
  }
  local_188._0_8_ = local_178;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_188,"metric","");
  local_90.write_.shared_alloc_.alloc = (Alloc *)local_1b0._M_allocated_capacity;
  if ((local_1b0._M_allocated_capacity & 7) == 0 &&
      (Alloc *)local_1b0._M_allocated_capacity != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_90.write_.shared_alloc_.alloc =
           (Alloc *)(*(ulong *)local_1b0._M_allocated_capacity * 8 + 1);
    }
    else {
      *(int *)(local_1b0._M_allocated_capacity + 0x30) =
           *(int *)(local_1b0._M_allocated_capacity + 0x30) + 1;
    }
  }
  local_90.write_.shared_alloc_.direct_ptr = (void *)local_1b0._8_8_;
  Mesh::add_tag<double>(mesh,0,(string *)local_188,local_18c,&local_90,false);
  pAVar3 = local_90.write_.shared_alloc_.alloc;
  if (((ulong)local_90.write_.shared_alloc_.alloc & 7) == 0 &&
      local_90.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             ((long)local_90.write_.shared_alloc_.alloc + 0x30);
    *(int *)&p_Var2->_vptr__Sp_counted_base = *(int *)&p_Var2->_vptr__Sp_counted_base + -1;
    if (*(int *)&p_Var2->_vptr__Sp_counted_base == 0) {
      Alloc::~Alloc(local_90.write_.shared_alloc_.alloc);
      operator_delete(pAVar3,0x48);
    }
  }
  if ((undefined1 *)local_188._0_8_ != local_178) {
    operator_delete((void *)local_188._0_8_,local_178._0_8_ + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"computing qualities\n",0x14);
  Mesh::ask_qualities((Mesh *)&local_40);
  if (((ulong)local_40._M_pi & 7) == 0 && (Alloc *)local_40._M_pi != (Alloc *)0x0) {
    p_Var2 = local_40._M_pi + 3;
    *(int *)&p_Var2->_vptr__Sp_counted_base = *(int *)&p_Var2->_vptr__Sp_counted_base + -1;
    if (*(int *)&p_Var2->_vptr__Sp_counted_base == 0) {
      Alloc::~Alloc((Alloc *)local_40._M_pi);
      operator_delete(local_40._M_pi,0x48);
    }
  }
  uVar4 = mesh->dim_;
  if (uVar4 < 4) {
    local_188._0_8_ = local_178;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_188,"quality","");
    Mesh::get_array<double>((Mesh *)&local_a0,(Int)mesh,(string *)(ulong)uVar4);
    if ((undefined1 *)local_188._0_8_ != local_178) {
      operator_delete((void *)local_188._0_8_,local_178._0_8_ + 1);
    }
    local_178._40_8_ = *(Real *)(local_178._40_8_ + 0x18);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"removing low-quality contributions\n",0x23);
    local_130.write_.shared_alloc_.alloc = local_1a0;
    if (((ulong)local_1a0 & 7) == 0 && local_1a0 != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_130.write_.shared_alloc_.alloc = (Alloc *)(local_1a0->size * 8 + 1);
      }
      else {
        local_1a0->use_count = local_1a0->use_count + 1;
      }
    }
    local_130.write_.shared_alloc_.direct_ptr = local_198;
    local_188._0_8_ = local_178;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_188,"");
    deep_copy<double>((Omega_h *)&local_148,&local_130,(string *)local_188);
    if ((undefined1 *)local_188._0_8_ != local_178) {
      operator_delete((void *)local_188._0_8_,local_178._0_8_ + 1);
    }
    pAVar3 = local_130.write_.shared_alloc_.alloc;
    if (((ulong)local_130.write_.shared_alloc_.alloc & 7) == 0 &&
        local_130.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_130.write_.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(pAVar3);
        operator_delete(pAVar3,0x48);
      }
    }
    local_188._0_8_ = local_a0;
    if (((ulong)local_a0 & 7) == 0 && local_a0 != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_188._0_8_ = local_a0->size * 8 + 1;
      }
      else {
        local_a0->use_count = local_a0->use_count + 1;
      }
    }
    local_188._8_8_ = local_98;
    local_178._0_8_ = local_178._40_8_;
    local_178._8_4_ = local_18c;
    local_178._16_8_ = local_148;
    if (((ulong)local_148 & 7) == 0 && local_148 != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_178._16_8_ = local_148->size * 8 + 1;
      }
      else {
        local_148->use_count = local_148->use_count + 1;
      }
    }
    local_178._24_8_ = local_140;
    LVar7 = Mesh::nelems(mesh);
    parallel_for<Omega_h::compute_ill_metric_dim<1>(Omega_h::Mesh*,Omega_h::AdaptOpts_const&,Omega_h_Isotropy)::_lambda(int)_1_>
              (LVar7,(type *)local_188,"ignore_low_quality_implied");
    local_b0.shared_alloc_.alloc = local_148;
    if (((ulong)local_148 & 7) == 0 && local_148 != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_b0.shared_alloc_.alloc = (Alloc *)(local_148->size * 8 + 1);
      }
      else {
        local_148->use_count = local_148->use_count + 1;
      }
    }
    local_b0.shared_alloc_.direct_ptr = local_140;
    Read<double>::Read((Read<signed_char> *)local_1d8,&local_b0);
    pAVar3 = local_1a0;
    if (((ulong)local_1a0 & 7) == 0 && local_1a0 != (Alloc *)0x0) {
      piVar1 = &local_1a0->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_1a0);
        operator_delete(pAVar3,0x48);
      }
    }
    pAVar3 = local_b0.shared_alloc_.alloc;
    local_1a0 = (Alloc *)local_1d8._0_8_;
    local_198 = (pointer)local_1d8._8_8_;
    if (((local_1d8._0_8_ & 7) == 0 && (Alloc *)local_1d8._0_8_ != (Alloc *)0x0) &&
       (entering_parallel == '\x01')) {
      *(int *)(local_1d8._0_8_ + 0x30) = *(int *)(local_1d8._0_8_ + 0x30) + -1;
      local_1a0 = (Alloc *)(*(long *)local_1d8._0_8_ * 8 + 1);
    }
    local_1d8._0_8_ = (Alloc *)0x0;
    local_1d8._8_8_ = (void *)0x0;
    if (((ulong)local_b0.shared_alloc_.alloc & 7) == 0 &&
        local_b0.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_b0.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_b0.shared_alloc_.alloc);
        operator_delete(pAVar3,0x48);
      }
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"done removing low-quality contributions\n",0x28);
    pAVar3 = (Alloc *)(local_1d8 + 0x10);
    local_1d8._0_8_ = pAVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"metric","");
    Mesh::remove_tag(mesh,1,(string *)local_1d8);
    if ((Alloc *)local_1d8._0_8_ != pAVar3) {
      operator_delete((void *)local_1d8._0_8_,local_1d8._16_8_ + 1);
    }
    local_1d8._0_8_ = pAVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"metric","");
    local_c0.write_.shared_alloc_.alloc = local_1a0;
    if (((ulong)local_1a0 & 7) == 0 && local_1a0 != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_c0.write_.shared_alloc_.alloc = (Alloc *)(local_1a0->size * 8 + 1);
      }
      else {
        local_1a0->use_count = local_1a0->use_count + 1;
      }
    }
    local_c0.write_.shared_alloc_.direct_ptr = local_198;
    Mesh::add_tag<double>(mesh,1,(string *)local_1d8,local_18c,&local_c0,false);
    pAVar6 = local_c0.write_.shared_alloc_.alloc;
    if (((ulong)local_c0.write_.shared_alloc_.alloc & 7) == 0 &&
        local_c0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_c0.write_.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_c0.write_.shared_alloc_.alloc);
        operator_delete(pAVar6,0x48);
      }
    }
    if ((Alloc *)local_1d8._0_8_ != pAVar3) {
      operator_delete((void *)local_1d8._0_8_,local_1d8._16_8_ + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"projecting metrics elem -> node\n",0x20);
    local_d0.write_.shared_alloc_.alloc = local_1a0;
    if (((ulong)local_1a0 & 7) == 0 && local_1a0 != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_d0.write_.shared_alloc_.alloc = (Alloc *)(local_1a0->size * 8 + 1);
      }
      else {
        local_1a0->use_count = local_1a0->use_count + 1;
      }
    }
    local_d0.write_.shared_alloc_.direct_ptr = local_198;
    project_metrics((Omega_h *)local_1d8,mesh,&local_d0);
    uVar5 = local_1b0._M_allocated_capacity;
    if ((local_1b0._M_allocated_capacity & 7) == 0 &&
        (Alloc *)local_1b0._M_allocated_capacity != (Alloc *)0x0) {
      piVar1 = (int *)(local_1b0._M_allocated_capacity + 0x30);
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc((Alloc *)local_1b0._M_allocated_capacity);
        operator_delete((void *)uVar5,0x48);
      }
    }
    local_1b0._M_allocated_capacity = local_1d8._0_8_;
    local_1b0._8_8_ = local_1d8._8_8_;
    if (((local_1d8._0_8_ & 7) == 0 && (Alloc *)local_1d8._0_8_ != (Alloc *)0x0) &&
       (entering_parallel == '\x01')) {
      *(int *)(local_1d8._0_8_ + 0x30) = *(int *)(local_1d8._0_8_ + 0x30) + -1;
      local_1b0._M_allocated_capacity = *(ulong *)local_1d8._0_8_ * 8 + 1;
    }
    pAVar6 = local_d0.write_.shared_alloc_.alloc;
    local_1d8._0_8_ = (Alloc *)0x0;
    local_1d8._8_8_ = (void *)0x0;
    if (((ulong)local_d0.write_.shared_alloc_.alloc & 7) == 0 &&
        local_d0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_d0.write_.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_d0.write_.shared_alloc_.alloc);
        operator_delete(pAVar6,0x48);
      }
    }
    local_1d8._0_8_ = pAVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"metric","");
    Mesh::remove_tag(mesh,0,(string *)local_1d8);
    if ((Alloc *)local_1d8._0_8_ != pAVar3) {
      operator_delete((void *)local_1d8._0_8_,local_1d8._16_8_ + 1);
    }
    local_1d8._0_8_ = pAVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"metric","");
    if ((local_1b0._M_allocated_capacity & 1) == 0) {
      uVar10 = *(ulong *)local_1b0._M_allocated_capacity;
    }
    else {
      uVar10 = local_1b0._M_allocated_capacity >> 3;
    }
    LVar7 = Mesh::nverts(mesh);
    iVar8 = divide_no_remainder<int>((int)(uVar10 >> 3),LVar7);
    local_e0.write_.shared_alloc_.alloc = (Alloc *)local_1b0._M_allocated_capacity;
    if ((local_1b0._M_allocated_capacity & 7) == 0 &&
        (Alloc *)local_1b0._M_allocated_capacity != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_e0.write_.shared_alloc_.alloc =
             (Alloc *)(*(ulong *)local_1b0._M_allocated_capacity * 8 + 1);
      }
      else {
        *(int *)(local_1b0._M_allocated_capacity + 0x30) =
             *(int *)(local_1b0._M_allocated_capacity + 0x30) + 1;
      }
    }
    local_e0.write_.shared_alloc_.direct_ptr = (void *)local_1b0._8_8_;
    Mesh::add_tag<double>(mesh,0,(string *)local_1d8,iVar8,&local_e0,false);
    pAVar6 = local_e0.write_.shared_alloc_.alloc;
    if (((ulong)local_e0.write_.shared_alloc_.alloc & 7) == 0 &&
        local_e0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_e0.write_.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(pAVar6);
        operator_delete(pAVar6,0x48);
      }
    }
    if ((Alloc *)local_1d8._0_8_ != pAVar3) {
      operator_delete((void *)local_1d8._0_8_,local_1d8._16_8_ + 1);
    }
    local_1d8._0_8_ = pAVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"metric","");
    Mesh::remove_tag(mesh,0,(string *)local_1d8);
    if ((Alloc *)local_1d8._0_8_ != pAVar3) {
      operator_delete((void *)local_1d8._0_8_,local_1d8._16_8_ + 1);
    }
    local_1d8._0_8_ = pAVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"metric","");
    if ((local_1b0._M_allocated_capacity & 1) == 0) {
      uVar10 = *(ulong *)local_1b0._M_allocated_capacity;
    }
    else {
      uVar10 = local_1b0._M_allocated_capacity >> 3;
    }
    LVar7 = Mesh::nverts(mesh);
    iVar8 = divide_no_remainder<int>((int)(uVar10 >> 3),LVar7);
    local_f0.write_.shared_alloc_.alloc = (Alloc *)local_1b0._M_allocated_capacity;
    if ((local_1b0._M_allocated_capacity & 7) == 0 &&
        (Alloc *)local_1b0._M_allocated_capacity != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_f0.write_.shared_alloc_.alloc =
             (Alloc *)(*(ulong *)local_1b0._M_allocated_capacity * 8 + 1);
      }
      else {
        *(int *)(local_1b0._M_allocated_capacity + 0x30) =
             *(int *)(local_1b0._M_allocated_capacity + 0x30) + 1;
      }
    }
    local_f0.write_.shared_alloc_.direct_ptr = (void *)local_1b0._8_8_;
    Mesh::add_tag<double>(mesh,0,(string *)local_1d8,iVar8,&local_f0,false);
    pAVar6 = local_f0.write_.shared_alloc_.alloc;
    if (((ulong)local_f0.write_.shared_alloc_.alloc & 7) == 0 &&
        local_f0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_f0.write_.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(pAVar6);
        operator_delete(pAVar6,0x48);
      }
    }
    if ((Alloc *)local_1d8._0_8_ != pAVar3) {
      operator_delete((void *)local_1d8._0_8_,local_1d8._16_8_ + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"limiting metric gradation\n",0x1a);
    local_100.write_.shared_alloc_.alloc = (Alloc *)local_1b0._M_allocated_capacity;
    if ((local_1b0._M_allocated_capacity & 7) == 0 &&
        (Alloc *)local_1b0._M_allocated_capacity != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_100.write_.shared_alloc_.alloc =
             (Alloc *)(*(ulong *)local_1b0._M_allocated_capacity * 8 + 1);
      }
      else {
        *(int *)(local_1b0._M_allocated_capacity + 0x30) =
             *(int *)(local_1b0._M_allocated_capacity + 0x30) + 1;
      }
    }
    local_100.write_.shared_alloc_.direct_ptr = (void *)local_1b0._8_8_;
    limit_metric_gradation((Omega_h *)local_1d8,mesh,&local_100,1.0,0.01,true);
    uVar5 = local_1b0._M_allocated_capacity;
    if ((local_1b0._M_allocated_capacity & 7) == 0 &&
        (Alloc *)local_1b0._M_allocated_capacity != (Alloc *)0x0) {
      piVar1 = (int *)(local_1b0._M_allocated_capacity + 0x30);
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc((Alloc *)local_1b0._M_allocated_capacity);
        operator_delete((void *)uVar5,0x48);
      }
    }
    local_1b0._M_allocated_capacity = local_1d8._0_8_;
    local_1b0._8_8_ = local_1d8._8_8_;
    if (((local_1d8._0_8_ & 7) == 0 && (Alloc *)local_1d8._0_8_ != (Alloc *)0x0) &&
       (entering_parallel == '\x01')) {
      *(int *)(local_1d8._0_8_ + 0x30) = *(int *)(local_1d8._0_8_ + 0x30) + -1;
      local_1b0._M_allocated_capacity = *(ulong *)local_1d8._0_8_ * 8 + 1;
    }
    pAVar6 = local_100.write_.shared_alloc_.alloc;
    local_1d8._0_8_ = (Alloc *)0x0;
    local_1d8._8_8_ = (void *)0x0;
    if (((ulong)local_100.write_.shared_alloc_.alloc & 7) == 0 &&
        local_100.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_100.write_.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(pAVar6);
        operator_delete(pAVar6,0x48);
      }
    }
    local_1d8._0_8_ = pAVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"metric","");
    Mesh::remove_tag(mesh,0,(string *)local_1d8);
    if ((Alloc *)local_1d8._0_8_ != pAVar3) {
      operator_delete((void *)local_1d8._0_8_,local_1d8._16_8_ + 1);
    }
    local_1d8._0_8_ = pAVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"metric","");
    if ((local_1b0._M_allocated_capacity & 1) == 0) {
      uVar10 = *(ulong *)local_1b0._M_allocated_capacity;
    }
    else {
      uVar10 = local_1b0._M_allocated_capacity >> 3;
    }
    LVar7 = Mesh::nverts(mesh);
    iVar8 = divide_no_remainder<int>((int)(uVar10 >> 3),LVar7);
    local_110.write_.shared_alloc_.alloc = (Alloc *)local_1b0._M_allocated_capacity;
    if ((local_1b0._M_allocated_capacity & 7) == 0 &&
        (Alloc *)local_1b0._M_allocated_capacity != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_110.write_.shared_alloc_.alloc =
             (Alloc *)(*(ulong *)local_1b0._M_allocated_capacity * 8 + 1);
      }
      else {
        *(int *)(local_1b0._M_allocated_capacity + 0x30) =
             *(int *)(local_1b0._M_allocated_capacity + 0x30) + 1;
      }
    }
    local_110.write_.shared_alloc_.direct_ptr = (void *)local_1b0._8_8_;
    Mesh::add_tag<double>(mesh,0,(string *)local_1d8,iVar8,&local_110,false);
    pAVar6 = local_110.write_.shared_alloc_.alloc;
    if (((ulong)local_110.write_.shared_alloc_.alloc & 7) == 0 &&
        local_110.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_110.write_.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(pAVar6);
        operator_delete(pAVar6,0x48);
      }
    }
    if ((Alloc *)local_1d8._0_8_ != pAVar3) {
      operator_delete((void *)local_1d8._0_8_,local_1d8._16_8_ + 1);
    }
    Mesh::ask_qualities((Mesh *)local_50);
    if (((ulong)local_50[0] & 7) == 0 && local_50[0] != (Alloc *)0x0) {
      piVar1 = &local_50[0]->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_50[0]);
        operator_delete(local_50[0],0x48);
      }
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"done with \"ill\" metric\n",0x17);
    uVar5 = local_178._16_8_;
    if ((local_178._16_8_ & 7) == 0 && (Alloc *)local_178._16_8_ != (Alloc *)0x0) {
      piVar1 = (int *)(local_178._16_8_ + 0x30);
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc((Alloc *)local_178._16_8_);
        operator_delete((void *)uVar5,0x48);
      }
    }
    uVar5 = local_188._0_8_;
    if ((local_188._0_8_ & 7) == 0 && (Alloc *)local_188._0_8_ != (Alloc *)0x0) {
      piVar1 = (int *)(local_188._0_8_ + 0x30);
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc((Alloc *)local_188._0_8_);
        operator_delete((void *)uVar5,0x48);
      }
    }
    if (((ulong)local_148 & 7) == 0 && local_148 != (Alloc *)0x0) {
      piVar1 = &local_148->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_148);
        operator_delete(local_148,0x48);
      }
    }
    if (((ulong)local_a0 & 7) == 0 && local_a0 != (Alloc *)0x0) {
      piVar1 = &local_a0->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_a0);
        operator_delete(local_a0,0x48);
      }
    }
    uVar5 = local_1b0._M_allocated_capacity;
    if ((local_1b0._M_allocated_capacity & 7) == 0 &&
        (Alloc *)local_1b0._M_allocated_capacity != (Alloc *)0x0) {
      piVar1 = (int *)(local_1b0._M_allocated_capacity + 0x30);
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc((Alloc *)local_1b0._M_allocated_capacity);
        operator_delete((void *)uVar5,0x48);
      }
    }
    pAVar3 = local_1a0;
    if (((ulong)local_1a0 & 7) == 0 && local_1a0 != (Alloc *)0x0) {
      piVar1 = &local_1a0->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_1a0);
        operator_delete(pAVar3,0x48);
      }
    }
    return;
  }
  fail("assertion %s failed at %s +%d\n","0 <= dim_ && dim_ <= 3",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_mesh.hpp"
       ,0x33);
}

Assistant:

void compute_ill_metric_dim(
    Mesh* mesh, AdaptOpts const& opts, Omega_h_Isotropy isotropy) {
  mesh->remove_tag(VERT, "metric");
  std::cout << "getting element implied metrics\n";
  auto elem_metrics = get_element_implied_length_metrics(mesh);
  elem_metrics = apply_isotropy(mesh->nelems(), elem_metrics, isotropy);
  auto ncomps = divide_no_remainder(elem_metrics.size(), mesh->nelems());
  mesh->add_tag(dim, "metric", ncomps, elem_metrics);
  std::cout << "projecting them\n";
  auto metrics = project_metrics(mesh, elem_metrics);
  OMEGA_H_CHECK(ncomps == divide_no_remainder(metrics.size(), mesh->nverts()));
  if (isotropy == OMEGA_H_ANISOTROPIC) {
    for (Int i = 0; i < 5; ++i) {
      std::cout << "metric smoothing iteration " << i << '\n';
      metrics = smooth_metric_once(mesh, metrics, true);
    }
  }
  mesh->add_tag(VERT, "metric", ncomps, metrics);
  std::cout << "computing qualities\n";
  mesh->ask_qualities();
  auto prelim_quals = mesh->get_array<Real>(mesh->dim(), "quality");
  auto min_qual = opts.min_quality_allowed;
  std::cout << "removing low-quality contributions\n";
  auto elem_metrics_w = deep_copy(elem_metrics);
  auto f = OMEGA_H_LAMBDA(LO e) {
    if (prelim_quals[e] < min_qual) {
      for (Int i = 0; i < ncomps; ++i) {
        elem_metrics_w[e * ncomps + i] = 0.;
      }
    }
  };
  parallel_for(mesh->nelems(), f, "ignore_low_quality_implied");
  elem_metrics = Reals(elem_metrics_w);
  std::cout << "done removing low-quality contributions\n";
  mesh->remove_tag(dim, "metric");
  mesh->add_tag(dim, "metric", ncomps, elem_metrics);
  std::cout << "projecting metrics elem -> node\n";
  metrics = project_metrics(mesh, elem_metrics);
  mesh->remove_tag(VERT, "metric");
  mesh->add_tag(VERT, "metric",
      divide_no_remainder(metrics.size(), mesh->nverts()), metrics);
  mesh->remove_tag(VERT, "metric");
  mesh->add_tag(VERT, "metric",
      divide_no_remainder(metrics.size(), mesh->nverts()), metrics);
  std::cout << "limiting metric gradation\n";
  metrics = limit_metric_gradation(mesh, metrics, 1.0);
  mesh->remove_tag(VERT, "metric");
  mesh->add_tag(VERT, "metric",
      divide_no_remainder(metrics.size(), mesh->nverts()), metrics);
  mesh->ask_qualities();
  std::cout << "done with \"ill\" metric\n";
}